

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  undefined1 *puVar6;
  void *pvVar7;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  u16 sz;
  u8 *pCell;
  u8 *pSrcEnd;
  int k;
  u8 *pData;
  u8 *pTmp;
  u8 *pCellptr;
  int iEnd;
  u32 j;
  int i;
  u8 *pEnd;
  int usableSize;
  u8 *aData;
  int hdr;
  undefined1 *local_80;
  undefined1 *local_78;
  int local_6c;
  undefined1 *local_68;
  undefined1 *local_58;
  uint local_48;
  int local_44;
  
  uVar4 = (uint)*(byte *)(in_RCX + 9);
  lVar3 = *(long *)(in_RCX + 0x50);
  uVar2 = *(uint *)(*(long *)(in_RCX + 0x48) + 0x38);
  puVar6 = (undefined1 *)(lVar3 + (int)uVar2);
  local_58 = *(undefined1 **)(in_RCX + 0x60);
  pvVar7 = sqlite3PagerTempSpace((Pager *)**(undefined8 **)(in_RCX + 0x48));
  local_48 = (uint)CONCAT11(*(undefined1 *)(lVar3 + (int)(uVar4 + 5)),
                            *(undefined1 *)(lVar3 + 1 + (long)(int)(uVar4 + 5)));
  if (uVar2 < local_48) {
    local_48 = 0;
  }
  memcpy((void *)((long)pvVar7 + (ulong)local_48),(void *)(lVar3 + (ulong)local_48),
         (ulong)(uVar2 - local_48));
  local_6c = 0;
  while (*(int *)(in_RDI + 0x50 + (long)local_6c * 4) <= in_ESI) {
    local_6c = local_6c + 1;
  }
  local_78 = *(undefined1 **)(in_RDI + 0x20 + (long)local_6c * 8);
  local_68 = puVar6;
  local_44 = in_ESI;
  while( true ) {
    local_80 = *(undefined1 **)(*(long *)(in_RDI + 0x10) + (long)local_44 * 8);
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x18) + (long)local_44 * 2);
    if ((local_80 < (undefined1 *)(lVar3 + (ulong)local_48)) || (puVar6 <= local_80)) {
      if ((local_78 < local_80 + (int)(uint)uVar1) && (local_80 < local_78)) {
        iVar5 = sqlite3CorruptError(0);
        return iVar5;
      }
    }
    else {
      if (puVar6 < local_80 + (int)(uint)uVar1) {
        iVar5 = sqlite3CorruptError(0);
        return iVar5;
      }
      local_80 = (undefined1 *)((long)pvVar7 + ((long)local_80 - lVar3));
    }
    local_68 = local_68 + -(long)(int)(uint)uVar1;
    *local_58 = (char)((ulong)((long)local_68 - lVar3) >> 8);
    local_58[1] = (char)local_68 - (char)lVar3;
    local_58 = local_58 + 2;
    if (local_68 < local_58) {
      iVar5 = sqlite3CorruptError(0);
      return iVar5;
    }
    memmove(local_68,local_80,(ulong)uVar1);
    local_44 = local_44 + 1;
    if (in_ESI + in_EDX <= local_44) break;
    if (*(int *)(in_RDI + 0x50 + (long)local_6c * 4) <= local_44) {
      local_6c = local_6c + 1;
      local_78 = *(undefined1 **)(in_RDI + 0x20 + (long)local_6c * 8);
    }
  }
  *(short *)(in_RCX + 0x18) = (short)in_EDX;
  *(undefined1 *)(in_RCX + 0xc) = 0;
  *(undefined1 *)(lVar3 + (int)(uVar4 + 1)) = 0;
  *(undefined1 *)(lVar3 + 1 + (long)(int)(uVar4 + 1)) = 0;
  *(char *)(lVar3 + (int)(uVar4 + 3)) = (char)((ushort)*(undefined2 *)(in_RCX + 0x18) >> 8);
  *(char *)(lVar3 + 1 + (long)(int)(uVar4 + 3)) = (char)*(undefined2 *)(in_RCX + 0x18);
  *(char *)(lVar3 + (int)(uVar4 + 5)) = (char)((ulong)((long)local_68 - lVar3) >> 8);
  *(char *)(lVar3 + 1 + (long)(int)(uVar4 + 5)) = (char)local_68 - (char)lVar3;
  *(undefined1 *)(lVar3 + (int)(uVar4 + 7)) = 0;
  return 0;
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( nCell>0 );
  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( j>(u32)usableSize ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  assert( pCArray->ixNx[NB*2-1]>i );
  for(k=0; pCArray->ixNx[k]<=i; k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData+j,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memmove(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}